

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_interp_CellCentroid_to_FaceCentroid
               (MultiFab *phi_centroid,MultiFab *phi_xface,MultiFab *phi_yface,MultiFab *phi_zface,
               int scomp,int dcomp,int ncomp,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs)

{
  int iVar1;
  undefined8 uVar2;
  pointer pBVar3;
  FabType FVar4;
  FabType FVar5;
  EBFArrayBoxFactory *this;
  FabArray<amrex::FArrayBox> *this_00;
  MultiCutFab *this_01;
  int *piVar6;
  int *piVar7;
  Periodicity PVar8;
  Array4<const_double> local_658;
  FabArray<amrex::FArrayBox> *local_618;
  FabArray<amrex::EBCellFlagFab> *local_610;
  Box txbx;
  Box txbx_1;
  Array4<const_double> local_578;
  Array4<const_double> local_538;
  Box local_4f8;
  Box local_4dc;
  Box local_4c0;
  Box local_4a4;
  Array<const_MultiCutFab_*,_3> local_488;
  Array<const_MultiCutFab_*,_3> local_470;
  Box result;
  int local_3d8;
  int iStack_3d4;
  int iStack_3c8;
  int iStack_3c4;
  Array4<double> local_2a8;
  Array4<double> local_268;
  Array4<double> local_228;
  MFIter mfi;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  local_618 = &phi_centroid->super_FabArray<amrex::FArrayBox>;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((phi_centroid->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_610 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
  this_00 = &EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
  EBFArrayBoxFactory::getAreaFrac(&local_470,this);
  EBFArrayBoxFactory::getFaceCent(&local_488,this);
  this_01 = EBFArrayBoxFactory::getCentroid(this);
  if (((long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 < (long)ncomp) {
    Assert_host("a_bcs.size() >= ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                ,0x426,(char *)0x0);
  }
  iVar1 = (a_geom->domain).smallend.vect[2];
  uVar2 = *(undefined8 *)(a_geom->domain).smallend.vect;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_xface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,0);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_yface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,0);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&phi_zface->super_FabArray<amrex::FArrayBox>,1e+40,dcomp,ncomp,0);
  pBVar3 = (a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44.do_tiling = false;
  local_44.dynamic = true;
  local_44.device_sync = true;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  MFIter::MFIter(&mfi,&local_618->super_FabArrayBase,&local_44);
  while( true ) {
    piVar7 = &mfi.currentIndex;
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::tilebox(&local_4a4,&mfi);
    MFIter::nodaltilebox(&local_4c0,&mfi,0);
    MFIter::nodaltilebox(&local_4dc,&mfi,1);
    MFIter::nodaltilebox(&local_4f8,&mfi,2);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_658,local_618,&mfi,scomp);
    piVar6 = piVar7;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    result.bigend.vect[2] = local_4a4.bigend.vect[2];
    result.btype.itype = local_4a4.btype.itype;
    result.smallend.vect[0] = local_4a4.smallend.vect[0];
    result.smallend.vect[1] = local_4a4.smallend.vect[1];
    FVar4 = EBCellFlagFab::getType
                      ((local_610->m_fabs_v).
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar6],&result);
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    result.bigend.vect[2] = local_4a4.bigend.vect[2];
    result.btype.itype = local_4a4.btype.itype;
    result.smallend.vect[0] = local_4a4.smallend.vect[0];
    result.smallend.vect[1] = local_4a4.smallend.vect[1];
    result.smallend.vect[0] = result.smallend.vect[0] + -4;
    result.smallend.vect[1] = result.smallend.vect[1] + -4;
    result.smallend.vect[2] = local_4a4.smallend.vect[2] + -4;
    result.bigend.vect[0] = local_4a4.bigend.vect[0] + 4;
    result.bigend.vect[1] = local_4a4.bigend.vect[1] + 4;
    result.bigend.vect[2] = result.bigend.vect[2] + 4;
    FVar5 = EBCellFlagFab::getType
                      ((local_610->m_fabs_v).
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar7],&result);
    if (FVar4 != covered) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_228,&phi_xface->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_268,&phi_yface->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2a8,&phi_zface->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      local_3d8 = (int)uVar2;
      iStack_3d4 = (int)((ulong)uVar2 >> 0x20);
      iStack_3c8 = (int)pBVar3;
      iStack_3c4 = (int)((ulong)pBVar3 >> 0x20);
      if (FVar5 == regular) {
        txbx_1.bigend.vect[2] = local_4c0.bigend.vect[2];
        txbx_1.btype.itype = local_4c0.btype.itype;
        txbx_1.smallend.vect[0] = local_4c0.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_4c0.smallend.vect[1];
        result.btype.itype = (uint)local_228.p;
        result.smallend.vect[0] = local_3d8;
        result.smallend.vect[1] = iStack_3d4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3c8;
        result.bigend.vect[2] = iStack_3c4;
        Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f62599b *)&result);
        txbx_1.bigend.vect[2] = local_4dc.bigend.vect[2];
        txbx_1.btype.itype = local_4dc.btype.itype;
        txbx_1.smallend.vect[0] = local_4dc.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_4dc.smallend.vect[1];
        result.btype.itype = (uint)local_268.p;
        result.smallend.vect[0] = local_3d8;
        result.smallend.vect[1] = iStack_3d4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3c8;
        result.bigend.vect[2] = iStack_3c4;
        Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f625d5c *)&result);
        txbx_1.bigend.vect[2] = local_4f8.bigend.vect[2];
        txbx_1.btype.itype = local_4f8.btype.itype;
        txbx_1.smallend.vect[0] = local_4f8.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_4f8.smallend.vect[1];
        result.btype.itype = (uint)local_2a8.p;
        result.smallend.vect[0] = local_3d8;
        result.smallend.vect[1] = iStack_3d4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3c8;
        result.bigend.vect[2] = iStack_3c4;
        Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f62611d *)&result);
      }
      else {
        MultiCutFab::const_array((Array4<const_double> *)&txbx_1,local_470._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_88,local_470._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_c8,local_470._M_elems[2],&mfi);
        MultiCutFab::const_array(&local_108,local_488._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_148,local_488._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_188,local_488._M_elems[2],&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_538,this_00,&mfi);
        MultiCutFab::const_array(&local_578,this_01,&mfi);
        txbx.bigend.vect[2] = local_4c0.bigend.vect[2];
        txbx.btype.itype = local_4c0.btype.itype;
        txbx.smallend.vect[0] = local_4c0.smallend.vect[0];
        txbx.smallend.vect[1] = local_4c0.smallend.vect[1];
        result.bigend.vect[2] = txbx_1.bigend.vect[2];
        result.btype = txbx_1.btype;
        result.smallend.vect[0] = txbx_1.smallend.vect[0];
        result.smallend.vect[1] = txbx_1.smallend.vect[1];
        Loop<amrex::eb_interp_centroid2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_424_9_c4b22738 *)&result);
        txbx.bigend.vect[2] = local_4dc.bigend.vect[2];
        txbx.btype.itype = local_4dc.btype.itype;
        txbx.smallend.vect[0] = local_4dc.smallend.vect[0];
        txbx.smallend.vect[1] = local_4dc.smallend.vect[1];
        result.bigend.vect[1] = (int)local_88.kstride;
        result.bigend.vect[2] = (int)((ulong)local_88.kstride >> 0x20);
        result.btype.itype = (uint)local_88.nstride;
        result.smallend.vect[0] = (int)local_88.p;
        result.smallend.vect[1] = (int)((ulong)local_88.p >> 0x20);
        result.smallend.vect[2] = (int)local_88.jstride;
        result.bigend.vect[0] = (int)((ulong)local_88.jstride >> 0x20);
        Loop<amrex::eb_interp_centroid2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_424_9_c0d7c319 *)&result);
        txbx.bigend.vect[2] = local_4f8.bigend.vect[2];
        txbx.btype.itype = local_4f8.btype.itype;
        txbx.smallend.vect[0] = local_4f8.smallend.vect[0];
        txbx.smallend.vect[1] = local_4f8.smallend.vect[1];
        result.bigend.vect[1] = (int)local_c8.kstride;
        result.bigend.vect[2] = (int)((ulong)local_c8.kstride >> 0x20);
        result.btype.itype = (uint)local_c8.nstride;
        result.smallend.vect[0] = (int)local_c8.p;
        result.smallend.vect[1] = (int)((ulong)local_c8.p >> 0x20);
        result.smallend.vect[2] = (int)local_c8.jstride;
        result.bigend.vect[0] = (int)((ulong)local_c8.jstride >> 0x20);
        Loop<amrex::eb_interp_centroid2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_424_9_bcfd5efa *)&result);
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_xface->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_yface->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&phi_zface->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  return;
}

Assistant:

void
EB_interp_CellCentroid_to_FaceCentroid (const MultiFab& phi_centroid,
                                        AMREX_D_DECL( MultiFab& phi_xface,
                                                      MultiFab& phi_yface,
                                                      MultiFab& phi_zface),
                                        int scomp, int dcomp, int ncomp,
                                        const Geometry& a_geom,
                                        const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(phi_centroid.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& area  = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();
    const auto& ccent = factory.getCentroid();

    // We assume that we start from the first component of bcs ... we may need to generalize this
    AMREX_ALWAYS_ASSERT(a_bcs.size() >= ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(phi_xface.setVal(1e40,dcomp,ncomp);,
                 phi_yface.setVal(1e40,dcomp,ncomp);,
                 phi_zface.setVal(1e40,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi_centroid, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = phi_centroid.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& phi_x = phi_xface.array(mfi,dcomp);,
                         Array4<Real> const& phi_y = phi_yface.array(mfi,dcomp);,
                         Array4<Real> const& phi_z = phi_zface.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, phi_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, phi_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, phi_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));

                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                Array4<Real const> const& cvol = vfrac.const_array(mfi);
                Array4<Real const> const& cct  = ccent.const_array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_centroid2facecent_x(txbx, ccfab, apxfab, cvol, cct, fcx, phi_x,
                                                       ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_centroid2facecent_y(tybx, ccfab, apyfab, cvol, cct, fcy, phi_y,
                                                       ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_centroid2facecent_z(tzbx, ccfab, apzfab, cvol, cct, fcz, phi_z,
                                                       ncomp, domain, d_bcs);
                     });
            }
        }
    }

    phi_xface.FillBoundary(a_geom.periodicity());
    phi_yface.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    phi_zface.FillBoundary(a_geom.periodicity());
#endif

}